

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyBalance.c
# Opt level: O0

Ivy_Man_t * Ivy_ManBalance(Ivy_Man_t *p,int fUpdateLevel)

{
  Ivy_Edge_t IVar1;
  int iVar2;
  int fCond;
  Ivy_Man_t *p_00;
  Ivy_Obj_t *pIVar3;
  void *pvVar4;
  Vec_Vec_t *vStore_00;
  Ivy_Obj_t *pObjOld;
  int local_3c;
  int NewNodeId;
  int i;
  Vec_Vec_t *vStore;
  Ivy_Obj_t *pDriver;
  Ivy_Obj_t *pObj;
  Ivy_Man_t *pNew;
  int fUpdateLevel_local;
  Ivy_Man_t *p_local;
  
  Ivy_ManCleanTravId(p);
  p_00 = Ivy_ManStart();
  pIVar3 = Ivy_ManConst1(p_00);
  IVar1 = Ivy_EdgeFromNode(pIVar3);
  pIVar3 = Ivy_ManConst1(p);
  pIVar3->TravId = IVar1;
  for (local_3c = 0; iVar2 = Vec_PtrSize(p->vPis), local_3c < iVar2; local_3c = local_3c + 1) {
    pvVar4 = Vec_PtrEntry(p->vPis,local_3c);
    pIVar3 = Ivy_ObjCreatePi(p_00);
    IVar1 = Ivy_EdgeFromNode(pIVar3);
    *(Ivy_Edge_t *)((long)pvVar4 + 4) = IVar1;
  }
  vStore_00 = Vec_VecAlloc(0x32);
  for (local_3c = 0; iVar2 = Vec_PtrSize(p->vPos), local_3c < iVar2; local_3c = local_3c + 1) {
    pIVar3 = (Ivy_Obj_t *)Vec_PtrEntry(p->vPos,local_3c);
    pIVar3 = Ivy_ObjChild0(pIVar3);
    pIVar3 = Ivy_ObjReal(pIVar3);
    pObjOld = Ivy_Regular(pIVar3);
    iVar2 = Ivy_NodeBalance_rec(p_00,pObjOld,vStore_00,0,fUpdateLevel);
    fCond = Ivy_IsComplement(pIVar3);
    IVar1 = Ivy_EdgeNotCond(iVar2,fCond);
    pIVar3 = Ivy_EdgeToNode(p_00,IVar1);
    Ivy_ObjCreatePo(p_00,pIVar3);
  }
  Vec_VecFree(vStore_00);
  Ivy_ManCleanup(p_00);
  iVar2 = Ivy_ManCheck(p_00);
  if (iVar2 == 0) {
    printf("Ivy_ManBalance(): The check has failed.\n");
  }
  return p_00;
}

Assistant:

Ivy_Man_t * Ivy_ManBalance( Ivy_Man_t * p, int fUpdateLevel )
{
    Ivy_Man_t * pNew;
    Ivy_Obj_t * pObj, * pDriver;
    Vec_Vec_t * vStore;
    int i, NewNodeId;
    // clean the old manager
    Ivy_ManCleanTravId( p );
    // create the new manager 
    pNew = Ivy_ManStart();
    // map the nodes
    Ivy_ManConst1(p)->TravId = Ivy_EdgeFromNode( Ivy_ManConst1(pNew) );
    Ivy_ManForEachPi( p, pObj, i )
        pObj->TravId = Ivy_EdgeFromNode( Ivy_ObjCreatePi(pNew) );
    // if HAIG is defined, trasfer the pointers to the PIs/latches
//    if ( p->pHaig )
//        Ivy_ManHaigTrasfer( p, pNew );
    // balance the AIG
    vStore = Vec_VecAlloc( 50 );
    Ivy_ManForEachPo( p, pObj, i )
    {
        pDriver   = Ivy_ObjReal( Ivy_ObjChild0(pObj) );
        NewNodeId = Ivy_NodeBalance_rec( pNew, Ivy_Regular(pDriver), vStore, 0, fUpdateLevel );
        NewNodeId = Ivy_EdgeNotCond( NewNodeId, Ivy_IsComplement(pDriver) );
        Ivy_ObjCreatePo( pNew, Ivy_EdgeToNode(pNew, NewNodeId) );
    }
    Vec_VecFree( vStore );
    if ( (i = Ivy_ManCleanup( pNew )) )
    {
//        printf( "Cleanup after balancing removed %d dangling nodes.\n", i );
    }
    // check the resulting AIG
    if ( !Ivy_ManCheck(pNew) )
        printf( "Ivy_ManBalance(): The check has failed.\n" );
    return pNew;
}